

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

bool adios2sys::SystemTools::TestFileAccess(char *filename,TestFilePermissions permissions)

{
  char *in_RDI;
  undefined7 in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffff9f;
  allocator local_39;
  string local_38 [55];
  byte local_1;
  
  if (in_RDI == (char *)0x0) {
    local_1 = 0;
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_38,in_RDI,&local_39);
    local_1 = TestFileAccess((string *)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98)
                             ,0);
    std::__cxx11::string::~string(local_38);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool SystemTools::TestFileAccess(const char* filename,
                                 TestFilePermissions permissions)
{
  if (!filename) {
    return false;
  }
  return SystemTools::TestFileAccess(std::string(filename), permissions);
}